

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O2

void __thiscall
chrono::ChArchiveExplorer::out_array_pre(ChArchiveExplorer *this,ChValue *bVal,size_t msize)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  ChValue *local_20;
  
  if ((this->found != true) || (this->find_all == true)) {
    pbVar1 = (this->search_tokens).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)this->tablevel <
        (ulong)((long)(this->search_tokens).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
      bVar2 = MatchName(this,pbVar1 + this->tablevel,(bVal->_name)._M_dataplus._M_p);
      if (this->tablevel == 0 || bVar2) {
        this->found_obj = true;
        uVar4 = (long)this->tablevel + 1;
        if ((long)(this->search_tokens).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->search_tokens).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar4) {
          iVar3 = (*bVal->_vptr_ChValue[2])(bVal);
          local_20 = (ChValue *)CONCAT44(extraout_var,iVar3);
          std::vector<chrono::ChValue*,std::allocator<chrono::ChValue*>>::
          emplace_back<chrono::ChValue*>
                    ((vector<chrono::ChValue*,std::allocator<chrono::ChValue*>> *)&this->results,
                     &local_20);
          this->found = true;
          uVar4 = (ulong)(this->tablevel + 1);
        }
        this->tablevel = (int)uVar4;
        std::vector<bool,_std::allocator<bool>_>::push_back(&this->in_array,true);
      }
    }
  }
  return;
}

Assistant:

virtual void out_array_pre (ChValue& bVal, size_t msize) {
            if (this->found && !this->find_all) return;
            if (this->tablevel >= this->search_tokens.size()) return;

            if (this->MatchName(search_tokens[this->tablevel], bVal.name()) || tablevel==0) {
                this->found_obj = true;
                
                if (this->tablevel +1 == this->search_tokens.size()) {
                    this->results.push_back(bVal.new_clone());
                    this->found = true;
                } 
                ++tablevel;
                in_array.push_back(true);
            }  
      }